

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetBooleanVerifier::verifyBoolean
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,bool reference)

{
  ostringstream *this_00;
  char *pcVar1;
  bool bVar2;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  undefined1 local_198 [384];
  
  state.m_preguard = 0xde;
  state.m_value = 0xde;
  state.m_postguard = 0xde;
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&state.m_value);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&state,testCtx);
  if ((bVar2) && ((bool)state.m_value != reference)) {
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected ");
    pcVar1 = "mapped_ == GL_FALSE";
    if (reference) {
      pcVar1 = "mapped_ == GL_TRUE";
    }
    std::operator<<((ostream *)this_00,pcVar1 + 0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyBoolean (tcu::TestContext& testCtx, GLenum name, bool reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean> state;
	glGetBooleanv(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	const GLboolean expectedGLState = reference ? GL_TRUE : GL_FALSE;

	if (state != expectedGLState)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << (reference ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}